

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlSetDocCompressMode(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_40;
  undefined4 local_34;
  undefined *puStack_30;
  int mode;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  PyObject *args_local;
  PyObject *self_local;
  
  doc = (xmlDocPtr)args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"Oi:xmlSetDocCompressMode",&stack0xffffffffffffffd0,&local_34);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (puStack_30 == &_Py_NoneStruct) {
      local_40 = (PyObject *)0x0;
    }
    else {
      local_40 = *(PyObject **)(puStack_30 + 0x10);
    }
    pyobj_doc = local_40;
    xmlSetDocCompressMode(local_40,local_34);
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlSetDocCompressMode(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    int mode;

    if (!PyArg_ParseTuple(args, (char *)"Oi:xmlSetDocCompressMode", &pyobj_doc, &mode))
        return(NULL);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);

    xmlSetDocCompressMode(doc, mode);
    Py_INCREF(Py_None);
    return(Py_None);
}